

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

string * __thiscall
helics::CommonCore::coreQuery_abi_cxx11_
          (string *__return_storage_ptr__,CommonCore *this,string_view queryStr,bool force_ordering)

{
  value_t vVar1;
  ushort index;
  pointer ppVar2;
  json_value jVar3;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  string_view request;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  bool bVar4;
  int iVar5;
  reference pvVar6;
  ulong uVar7;
  string *string;
  string *val;
  const_iterator cVar8;
  pointer ptVar9;
  char *pcVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar11;
  GlobalFederateId *ele;
  size_t sVar12;
  FedInfo *pFVar13;
  object_t *poVar14;
  _Head_base<0UL,_helics::fileops::JsonMapBuilder,_false> *this_00;
  GlobalFederateId *dep_1;
  pointer ppVar15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view request_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  string_view fmt;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_15;
  initializer_list_t init;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  format_args args;
  string_view queryStr_local;
  json tagBlock;
  json base;
  int local_13c;
  const_iterator __end0;
  string interfaceQueryResult;
  data local_100;
  data local_f0;
  string res;
  data local_c0;
  data local_b0;
  data local_a0;
  data local_90;
  data local_80;
  key_type local_70;
  key_type local_50;
  
  queryStr_local._M_str = queryStr._M_str;
  queryStr_local._M_len = queryStr._M_len;
  quickCoreQueries_abi_cxx11_(&res,this,queryStr);
  if (res._M_string_length != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res._M_dataplus._M_p == &res.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(res.field_2._M_allocated_capacity._1_7_,res.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = res.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = res._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(res.field_2._M_allocated_capacity._1_7_,res.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = res._M_string_length;
    res._M_string_length = 0;
    res.field_2._M_local_buf[0] = '\0';
    res._M_dataplus._M_p = (pointer)&res.field_2;
    goto LAB_0024ebb9;
  }
  __y._M_str = "federates";
  __y._M_len = 9;
  bVar4 = std::operator==(queryStr,__y);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[",(allocator<char> *)&tagBlock);
    gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
    begin((const_iterator *)&interfaceQueryResult,&(this->loopFederates).dataStorage);
    gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
              (&__end0,&(this->loopFederates).dataStorage);
    while ((interfaceQueryResult.field_2._M_allocated_capacity._0_4_ != __end0.offset ||
           ((FedInfo **)interfaceQueryResult._M_dataplus._M_p != __end0.vec))) {
      std::__cxx11::string::string
                ((string *)&base,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  interfaceQueryResult._M_string_length);
      generateJsonQuotedString((string *)&tagBlock,(string *)&base);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,(string *)&tagBlock);
      std::__cxx11::string::~string((string *)&tagBlock);
      std::__cxx11::string::~string((string *)&base);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,',');
      gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
      operator++((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
                 &interfaceQueryResult);
    }
    if (__return_storage_ptr__->_M_string_length < 2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,']');
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] = ']'
      ;
    }
    goto LAB_0024ebb9;
  }
  __x._M_str = queryStr_local._M_str;
  __x._M_len = queryStr_local._M_len;
  __y_00._M_str = "tags";
  __y_00._M_len = 4;
  bVar4 = std::operator==(__x,__y_00);
  if (bVar4) {
    init._M_len = 0;
    init._M_array = (iterator)&tagBlock;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::object(init);
    ppVar2 = (this->tags).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar15 = (this->tags).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar2;
        ppVar15 = ppVar15 + 1) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_f0,&ppVar15->second);
      std::__cxx11::string::string((string *)&local_50,&ppVar15->first);
      pvVar6 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](&tagBlock,&local_50);
      vVar1 = (pvVar6->m_data).m_type;
      (pvVar6->m_data).m_type = local_f0.m_type;
      jVar3 = (pvVar6->m_data).m_value;
      (pvVar6->m_data).m_value = local_f0.m_value;
      local_f0.m_type = vVar1;
      local_f0.m_value = jVar3;
      std::__cxx11::string::~string((string *)&local_50);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_f0);
    }
    fileops::generateJsonString(__return_storage_ptr__,&tagBlock,true);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&tagBlock.m_data);
    goto LAB_0024ebb9;
  }
  iVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)&queryStr_local,0,4,"tag/")
  ;
  if (iVar5 == 0) {
    pcVar10 = queryStr_local._M_str + 4;
    sVar12 = queryStr_local._M_len - 4;
    ppVar2 = (this->tags).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar15 = (this->tags).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar2;
        ppVar15 = ppVar15 + 1) {
      __y_01._M_str = (ppVar15->first)._M_dataplus._M_p;
      __y_01._M_len = (ppVar15->first)._M_string_length;
      __x_14._M_str = pcVar10;
      __x_14._M_len = sVar12;
      bVar4 = std::operator==(__x_14,__y_01);
      if (bVar4) {
        generateJsonQuotedString((string *)__return_storage_ptr__,&ppVar15->second);
        goto LAB_0024ebb9;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\"\"",(allocator<char> *)&tagBlock);
    goto LAB_0024ebb9;
  }
  aVar11.values_ = (value<fmt::v11::context> *)&tagBlock;
  tagBlock.m_data.m_value.object = (object_t *)0x0;
  request_00._M_str = (char *)&this->loopHandles;
  request_00._M_len = (size_t)queryStr_local._M_str;
  tagBlock.m_data._0_8_ = this;
  generateInterfaceQueryResults
            (&interfaceQueryResult,(helics *)queryStr_local._M_len,request_00,
             (HandleManager *)0x8831d580,(GlobalFederateId)aVar11._0_4_,
             (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              *)queryStr_local._M_len);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&tagBlock);
  if (interfaceQueryResult._M_string_length == 0) {
    __x_00._M_str = queryStr_local._M_str;
    __x_00._M_len = queryStr_local._M_len;
    __y_02._M_str = "dependson";
    __y_02._M_len = 9;
    bVar4 = std::operator==(__x_00,__y_02);
    if (bVar4) {
      BaseTimeCoordinator::getDependencies
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &__end0,(this->super_BrokerBase).timeCoord._M_t.
                         super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                         .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[",(allocator<char> *)&tagBlock);
      for (pFVar13 = (FedInfo *)__end0.vec; pFVar13 != __end0.ptr;
          pFVar13 = (FedInfo *)((long)&pFVar13->fed + 4)) {
        CLI::std::__cxx11::to_string((string *)&base,*(int *)&pFVar13->fed);
        generateJsonQuotedString((string *)&tagBlock,(string *)&base);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,(string *)&tagBlock);
        std::__cxx11::string::~string((string *)&tagBlock);
        std::__cxx11::string::~string((string *)&base);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,',');
      }
      uVar7 = __return_storage_ptr__->_M_string_length;
      if (uVar7 < 2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,']');
      }
      else {
LAB_0024efec:
        (__return_storage_ptr__->_M_dataplus)._M_p[uVar7 - 1] = ']';
      }
    }
    else {
      __x_01._M_str = queryStr_local._M_str;
      __x_01._M_len = queryStr_local._M_len;
      __y_03._M_str = "dependents";
      __y_03._M_len = 10;
      bVar4 = std::operator==(__x_01,__y_03);
      if (!bVar4) {
        __x_02._M_str = queryStr_local._M_str;
        __x_02._M_len = queryStr_local._M_len;
        __y_04._M_str = "isinit";
        __y_04._M_len = 6;
        bVar4 = std::operator==(__x_02,__y_04);
        if (bVar4) {
          bVar4 = allInitReady(this);
          pcVar10 = "false";
          if (bVar4) {
            pcVar10 = "true";
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,pcVar10,(allocator<char> *)&tagBlock);
        }
        else {
          __x_03._M_str = queryStr_local._M_str;
          __x_03._M_len = queryStr_local._M_len;
          __y_05._M_str = "logs";
          __y_05._M_len = 4;
          bVar4 = std::operator==(__x_03,__y_05);
          if (bVar4) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json(&base,(nullptr_t)0x0);
            tagBlock.m_data.m_type = null;
            tagBlock.m_data._1_7_ = 0;
            tagBlock.m_data.m_value.object = (object_t *)0x0;
            loadBasicJsonInfo(this,&base,
                              (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                               *)&tagBlock);
            CLI::std::_Function_base::~_Function_base((_Function_base *)&tagBlock);
            bufferToJson(&((this->super_BrokerBase).mLogManager.
                           super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->mLogBuffer,&base);
            fileops::generateJsonString(__return_storage_ptr__,&base,true);
            goto LAB_0024f071;
          }
          __x_04._M_str = queryStr_local._M_str;
          __x_04._M_len = queryStr_local._M_len;
          __y_06._M_str = "address";
          __y_06._M_len = 7;
          bVar4 = std::operator==(__x_04,__y_06);
          if (bVar4) {
            string = getAddress_abi_cxx11_(this);
            generateJsonQuotedString((string *)__return_storage_ptr__,(string *)string);
          }
          else {
            __x_05._M_str = queryStr_local._M_str;
            __x_05._M_len = queryStr_local._M_len;
            __y_07._M_str = "counter";
            __y_07._M_len = 7;
            bVar4 = std::operator==(__x_05,__y_07);
            if (bVar4) {
              iVar5 = generateMapObjectCounter(this);
              tagBlock.m_data._0_4_ = iVar5;
              fmt.size_ = 1;
              fmt.data_ = (char *)0x2;
              args.field_1.args_ = aVar11.args_;
              args.desc_ = (unsigned_long_long)&tagBlock;
              ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)0x3424ae,fmt,args);
            }
            else {
              __x_06._M_str = queryStr_local._M_str;
              __x_06._M_len = queryStr_local._M_len;
              __y_08._M_str = "filtered_endpoints";
              __y_08._M_len = 0x12;
              bVar4 = std::operator==(__x_06,__y_08);
              if (bVar4) {
                filteredEndpointQuery_abi_cxx11_(__return_storage_ptr__,this,(FederateState *)0x0);
              }
              else {
                __x_07._M_str = queryStr_local._M_str;
                __x_07._M_len = queryStr_local._M_len;
                __y_09._M_str = "current_time";
                __y_09._M_len = 0xc;
                bVar4 = std::operator==(__x_07,__y_09);
                if (bVar4) {
                  if ((this->super_BrokerBase).hasTimeDependency == false) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"{}",(allocator<char> *)&tagBlock);
                  }
                  else {
                    (*((this->super_BrokerBase).timeCoord._M_t.
                       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
                      _vptr_BaseTimeCoordinator[0xb])(__return_storage_ptr__);
                  }
                }
                else {
                  __x_08._M_str = queryStr_local._M_str;
                  __x_08._M_len = queryStr_local._M_len;
                  __y_10._M_str = "version_all";
                  __y_10._M_len = 0xb;
                  bVar4 = std::operator==(__x_08,__y_10);
                  if (bVar4) {
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::basic_json(&base,(nullptr_t)0x0);
                    tagBlock.m_data.m_type = null;
                    tagBlock.m_data._1_7_ = 0;
                    tagBlock.m_data.m_value.object = (object_t *)0x0;
                    loadBasicJsonInfo(this,&base,
                                      (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                                       *)&tagBlock);
                    CLI::std::_Function_base::~_Function_base((_Function_base *)&tagBlock);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::basic_json<const_char_*const_&,_const_char_*,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_80,&versionString);
                    pvVar6 = nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                         *)&base,"version");
                    vVar1 = (pvVar6->m_data).m_type;
                    (pvVar6->m_data).m_type = local_80.m_type;
                    jVar3 = (pvVar6->m_data).m_value;
                    (pvVar6->m_data).m_value = local_80.m_value;
                    local_80.m_type = vVar1;
                    local_80.m_value = jVar3;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::data::~data(&local_80);
                    fileops::generateJsonString(__return_storage_ptr__,&base,true);
                  }
                  else {
                    __x_09._M_str = queryStr_local._M_str;
                    __x_09._M_len = queryStr_local._M_len;
                    __y_11._M_str = "current_state";
                    __y_11._M_len = 0xd;
                    bVar4 = std::operator==(__x_09,__y_11);
                    if (bVar4) {
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::basic_json(&base,(nullptr_t)0x0);
                      tagBlock.m_data.m_type = null;
                      tagBlock.m_data._1_7_ = 0;
                      tagBlock.m_data.m_value.object = (object_t *)0x0;
                      loadBasicJsonInfo(this,&base,
                                        (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                                         *)&tagBlock);
                      CLI::std::_Function_base::~_Function_base((_Function_base *)&tagBlock);
                      val = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::
                      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&local_90,val);
                      pvVar6 = nlohmann::json_abi_v3_11_3::
                               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               ::operator[]<char_const>
                                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                           *)&base,"state");
                      vVar1 = (pvVar6->m_data).m_type;
                      (pvVar6->m_data).m_type = local_90.m_type;
                      jVar3 = (pvVar6->m_data).m_value;
                      (pvVar6->m_data).m_value = local_90.m_value;
                      local_90.m_type = vVar1;
                      local_90.m_value = jVar3;
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::data::~data(&local_90);
                      fileops::generateJsonString(__return_storage_ptr__,&base,true);
                    }
                    else {
                      __x_10._M_str = queryStr_local._M_str;
                      __x_10._M_len = queryStr_local._M_len;
                      __y_12._M_str = "interfaces";
                      __y_12._M_len = 10;
                      bVar4 = std::operator==(__x_10,__y_12);
                      if (bVar4) {
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::basic_json(&base,(nullptr_t)0x0);
                        tagBlock.m_data.m_value.object = (object_t *)0x0;
                        tagBlock.m_data._0_8_ = this;
                        loadBasicJsonInfo(this,&base,
                                          (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                                           *)&tagBlock);
                        CLI::std::_Function_base::~_Function_base((_Function_base *)&tagBlock);
                        fileops::generateJsonString(__return_storage_ptr__,&base,true);
                      }
                      else {
                        cVar8 = std::
                                _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                                ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                                        *)mapIndex,&queryStr_local);
                        if (cVar8._M_node != (_Base_ptr)(mapIndex + 8)) {
                          index = *(ushort *)&cVar8._M_node[1]._M_left;
                          ptVar9 = (this->mapBuilders).
                                   super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          if (((uint)index <
                               ((uint)(((long)(this->mapBuilders).
                                              super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ptVar9) / 0x60) & 0xffff)) &&
                             (*(char *)((long)&cVar8._M_node[1]._M_left + 2) == '\0')) {
                            this_00 = &ptVar9[index].
                                       super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                       .
                                       super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>
                            ;
                            bVar4 = fileops::JsonMapBuilder::isCompleted(&this_00->_M_head_impl);
                            if (bVar4) {
                              iVar5 = generateMapObjectCounter(this);
                              if (iVar5 == ptVar9[index].
                                           super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                           .
                                           super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>
                                           ._M_head_impl.counterCode) {
                                fileops::JsonMapBuilder::generate_abi_cxx11_
                                          (__return_storage_ptr__,&this_00->_M_head_impl);
                                goto LAB_0024f092;
                              }
                              fileops::JsonMapBuilder::reset(&this_00->_M_head_impl);
                            }
                            if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)(this_00->_M_head_impl).jMap._M_t.
                                   super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                   .
                                   super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                                != (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)0x0) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)__return_storage_ptr__,"#wait",
                                         (allocator<char> *)&tagBlock);
                              goto LAB_0024f092;
                            }
                          }
                          request._M_str = queryStr_local._M_str;
                          request._M_len = queryStr_local._M_len;
                          initializeMapBuilder
                                    (this,request,index,
                                     *(QueryReuse *)((long)&cVar8._M_node[1]._M_left + 2),
                                     force_ordering);
                          bVar4 = fileops::JsonMapBuilder::isCompleted
                                            (&(this->mapBuilders).
                                              super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[index].
                                              super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                              .
                                              super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>
                                              ._M_head_impl);
                          if (bVar4) {
                            if (*(char *)((long)&cVar8._M_node[1]._M_left + 2) == '\0') {
                              iVar5 = generateMapObjectCounter(this);
                              ptVar9 = (this->mapBuilders).
                                       super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              ptVar9[index].
                              super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                              .super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                              _M_head_impl.counterCode = iVar5;
                            }
                            else {
                              ptVar9 = (this->mapBuilders).
                                       super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                            }
                            fileops::JsonMapBuilder::generate_abi_cxx11_
                                      (__return_storage_ptr__,
                                       &ptVar9[index].
                                        super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                        .
                                        super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>
                                        ._M_head_impl);
                          }
                          else {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)__return_storage_ptr__,"#wait",
                                       (allocator<char> *)&tagBlock);
                          }
                          goto LAB_0024f092;
                        }
                        __x_11._M_str = queryStr_local._M_str;
                        __x_11._M_len = queryStr_local._M_len;
                        __y_13._M_str = "dependencies";
                        __y_13._M_len = 0xc;
                        bVar4 = std::operator==(__x_11,__y_13);
                        if (bVar4) {
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::basic_json(&base,(nullptr_t)0x0);
                          tagBlock.m_data.m_type = null;
                          tagBlock.m_data._1_7_ = 0;
                          tagBlock.m_data.m_value.object = (object_t *)0x0;
                          loadBasicJsonInfo(this,&base,
                                            (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                                             *)&tagBlock);
                          CLI::std::_Function_base::~_Function_base((_Function_base *)&tagBlock);
                          init_00._M_len = 0;
                          init_00._M_array = (iterator)&local_a0;
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::array(init_00);
                          pvVar6 = nlohmann::json_abi_v3_11_3::
                                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   ::operator[]<char_const>
                                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                               *)&base,"dependents");
                          vVar1 = (pvVar6->m_data).m_type;
                          (pvVar6->m_data).m_type = local_a0.m_type;
                          jVar3 = (pvVar6->m_data).m_value;
                          (pvVar6->m_data).m_value = local_a0.m_value;
                          local_a0.m_type = vVar1;
                          local_a0.m_value = jVar3;
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::data::~data(&local_a0);
                          BaseTimeCoordinator::getDependents
                                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                      *)&tagBlock,
                                     (this->super_BrokerBase).timeCoord._M_t.
                                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>.
                                     _M_head_impl);
                          jVar3 = tagBlock.m_data.m_value;
                          for (poVar14 = (object_t *)tagBlock.m_data._0_8_; poVar14 != jVar3.object;
                              poVar14 = (object_t *)&(poVar14->_M_t)._M_impl.field_0x4) {
                            pvVar6 = nlohmann::json_abi_v3_11_3::
                                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                     ::operator[]<char_const>
                                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                                 *)&base,"dependents");
                            local_13c = *(int *)&(poVar14->_M_t)._M_impl;
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::basic_json<int,_int,_0>
                                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                        *)&__end0,&local_13c);
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::push_back(pvVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                *)&__end0);
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::data::~data((data *)&__end0);
                          }
                          std::
                          _Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                          ::~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                           *)&tagBlock);
                          init_02._M_len = 0;
                          init_02._M_array = (iterator)&local_b0;
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::array(init_02);
                          pvVar6 = nlohmann::json_abi_v3_11_3::
                                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   ::operator[]<char_const>
                                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                               *)&base,"dependencies");
                          vVar1 = (pvVar6->m_data).m_type;
                          (pvVar6->m_data).m_type = local_b0.m_type;
                          jVar3 = (pvVar6->m_data).m_value;
                          (pvVar6->m_data).m_value = local_b0.m_value;
                          local_b0.m_type = vVar1;
                          local_b0.m_value = jVar3;
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::data::~data(&local_b0);
                          BaseTimeCoordinator::getDependencies
                                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                      *)&tagBlock,
                                     (this->super_BrokerBase).timeCoord._M_t.
                                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>.
                                     _M_head_impl);
                          jVar3 = tagBlock.m_data.m_value;
                          for (poVar14 = (object_t *)tagBlock.m_data._0_8_; poVar14 != jVar3.object;
                              poVar14 = (object_t *)&(poVar14->_M_t)._M_impl.field_0x4) {
                            pvVar6 = nlohmann::json_abi_v3_11_3::
                                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                     ::operator[]<char_const>
                                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                                 *)&base,"dependencies");
                            local_13c = *(int *)&(poVar14->_M_t)._M_impl;
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::basic_json<int,_int,_0>
                                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                        *)&__end0,&local_13c);
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::push_back(pvVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                *)&__end0);
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::data::~data((data *)&__end0);
                          }
                          std::
                          _Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                          ::~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                           *)&tagBlock);
                          fileops::generateJsonString(__return_storage_ptr__,&base,true);
                        }
                        else {
                          __x_12._M_str = queryStr_local._M_str;
                          __x_12._M_len = queryStr_local._M_len;
                          __y_14._M_str = "federate_map";
                          __y_14._M_len = 0xc;
                          bVar4 = std::operator==(__x_12,__y_14);
                          if (!bVar4) {
                            ppVar2 = (this->tags).
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                            for (ppVar15 = (this->tags).
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                ppVar15 != ppVar2; ppVar15 = ppVar15 + 1) {
                              __x_13._M_str = queryStr_local._M_str;
                              __x_13._M_len = queryStr_local._M_len;
                              __y_15._M_str = (ppVar15->first)._M_dataplus._M_p;
                              __y_15._M_len = (ppVar15->first)._M_string_length;
                              bVar4 = std::operator==(__x_13,__y_15);
                              if (bVar4) {
                                generateJsonQuotedString
                                          ((string *)__return_storage_ptr__,&ppVar15->second);
                                goto LAB_0024f092;
                              }
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&tagBlock,"unrecognized core query",
                                       (allocator<char> *)&base);
                            generateJsonErrorResponse
                                      (__return_storage_ptr__,BAD_REQUEST,(string *)&tagBlock);
                            std::__cxx11::string::~string((string *)&tagBlock);
                            goto LAB_0024f092;
                          }
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::basic_json(&base,(nullptr_t)0x0);
                          tagBlock.m_data.m_type = null;
                          tagBlock.m_data._1_7_ = 0;
                          tagBlock.m_data.m_value.object = (object_t *)0x0;
                          loadBasicJsonInfo(this,&base,
                                            (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                                             *)&tagBlock);
                          CLI::std::_Function_base::~_Function_base((_Function_base *)&tagBlock);
                          if ((this->tags).
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start !=
                              (this->tags).
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                            init_01._M_len = 0;
                            init_01._M_array = (iterator)&tagBlock;
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::object(init_01);
                            ppVar2 = (this->tags).
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                            for (ppVar15 = (this->tags).
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                ppVar15 != ppVar2; ppVar15 = ppVar15 + 1) {
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::
                              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          *)&local_100,&ppVar15->second);
                              std::__cxx11::string::string((string *)&local_70,&ppVar15->first);
                              pvVar6 = nlohmann::json_abi_v3_11_3::
                                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       ::operator[](&tagBlock,&local_70);
                              vVar1 = (pvVar6->m_data).m_type;
                              (pvVar6->m_data).m_type = local_100.m_type;
                              jVar3 = (pvVar6->m_data).m_value;
                              (pvVar6->m_data).m_value = local_100.m_value;
                              local_100.m_type = vVar1;
                              local_100.m_value = jVar3;
                              std::__cxx11::string::~string((string *)&local_70);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::data::~data(&local_100);
                            }
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          *)&local_c0,&tagBlock);
                            pvVar6 = nlohmann::json_abi_v3_11_3::
                                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                     ::operator[]<char_const>
                                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                                 *)&base,"tags");
                            vVar1 = (pvVar6->m_data).m_type;
                            (pvVar6->m_data).m_type = local_c0.m_type;
                            jVar3 = (pvVar6->m_data).m_value;
                            (pvVar6->m_data).m_value = local_c0.m_value;
                            local_c0.m_type = vVar1;
                            local_c0.m_value = jVar3;
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::data::~data(&local_c0);
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::data::~data(&tagBlock.m_data);
                          }
                          fileops::generateJsonString(__return_storage_ptr__,&base,true);
                        }
                      }
                    }
                  }
LAB_0024f071:
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&base.m_data);
                }
              }
            }
          }
        }
        goto LAB_0024f092;
      }
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &__end0,(this->super_BrokerBase).timeCoord._M_t.
                         super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                         .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[",(allocator<char> *)&tagBlock);
      for (pFVar13 = (FedInfo *)__end0.vec; pFVar13 != __end0.ptr;
          pFVar13 = (FedInfo *)((long)&pFVar13->fed + 4)) {
        CLI::std::__cxx11::to_string((string *)&base,*(int *)&pFVar13->fed);
        generateJsonQuotedString((string *)&tagBlock,(string *)&base);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,(string *)&tagBlock);
        std::__cxx11::string::~string((string *)&tagBlock);
        std::__cxx11::string::~string((string *)&base);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,',');
      }
      uVar7 = __return_storage_ptr__->_M_string_length;
      if (1 < uVar7) goto LAB_0024efec;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,']');
    }
    std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
    ~_Vector_base((_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                   *)&__end0);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)interfaceQueryResult._M_dataplus._M_p == &interfaceQueryResult.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT44(interfaceQueryResult.field_2._M_allocated_capacity._4_4_,
                    interfaceQueryResult.field_2._M_allocated_capacity._0_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
           interfaceQueryResult.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = interfaceQueryResult._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT44(interfaceQueryResult.field_2._M_allocated_capacity._4_4_,
                    interfaceQueryResult.field_2._M_allocated_capacity._0_4_);
    }
    __return_storage_ptr__->_M_string_length = interfaceQueryResult._M_string_length;
    interfaceQueryResult._M_string_length = 0;
    interfaceQueryResult.field_2._M_allocated_capacity._0_4_ =
         interfaceQueryResult.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    interfaceQueryResult._M_dataplus._M_p = (pointer)&interfaceQueryResult.field_2;
  }
LAB_0024f092:
  std::__cxx11::string::~string((string *)&interfaceQueryResult);
LAB_0024ebb9:
  std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::string CommonCore::coreQuery(std::string_view queryStr, bool force_ordering) const
{
    auto addHeader = [this](nlohmann::json& base) { loadBasicJsonInfo(base, nullptr); };

    auto res = quickCoreQueries(queryStr);
    if (!res.empty()) {
        return res;
    }
    if (queryStr == "federates") {
        return generateStringVector(loopFederates,
                                    [](const auto& fed) { return fed->getIdentifier(); });
    }
    if (queryStr == "tags") {
        nlohmann::json tagBlock = nlohmann::json::object();
        for (const auto& tag : tags) {
            tagBlock[tag.first] = tag.second;
        }
        return fileops::generateJsonString(tagBlock);
    }
    if (queryStr.compare(0, 4, "tag/") == 0) {
        std::string_view queriedTag = queryStr;
        queriedTag.remove_prefix(4);
        for (const auto& tag : tags) {
            if (queriedTag == tag.first) {
                return generateJsonQuotedString(tag.second);
            }
        }
        return "\"\"";
    }
    auto interfaceQueryResult =
        generateInterfaceQueryResults(queryStr, loopHandles, GlobalFederateId{}, addHeader);
    if (!interfaceQueryResult.empty()) {
        return interfaceQueryResult;
    }
    if (queryStr == "dependson") {
        return generateStringVector(timeCoord->getDependencies(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (queryStr == "dependents") {
        return generateStringVector(timeCoord->getDependents(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }

    if (queryStr == "isinit") {
        return (allInitReady()) ? "true" : "false";
    }
    if (queryStr == "logs") {
        nlohmann::json base;
        loadBasicJsonInfo(base, nullptr);
        bufferToJson(mLogManager->getLogBuffer(), base);
        return fileops::generateJsonString(base);
    }
    if (queryStr == "address") {
        return generateJsonQuotedString(getAddress());
    }
    if (queryStr == "counter") {
        return fmt::format("{}", generateMapObjectCounter());
    }
    if (queryStr == "filtered_endpoints") {
        return filteredEndpointQuery(nullptr);
    }
    if (queryStr == "current_time") {
        if (!hasTimeDependency) {
            return "{}";
        }
        return timeCoord->printTimeStatus();
    }
    if (queryStr == "version_all") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [](nlohmann::json& /*val*/, const FedInfo& /*fed*/) {});
        base["version"] = versionString;
        return fileops::generateJsonString(base);
    }
    if (queryStr == "current_state") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [](nlohmann::json& val, const FedInfo& fed) {
            val["state"] = stateString(fed.state);
        });
        base["state"] = brokerStateName(getBrokerState());

        return fileops::generateJsonString(base);
    }
    if (queryStr == "interfaces") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [this](nlohmann::json& val, const FedInfo& fed) {
            generateInterfaceConfig(val, loopHandles, fed->global_id);
        });
        return fileops::generateJsonString(base);
    }
    auto maploc = mapIndex.find(queryStr);
    if (maploc != mapIndex.end()) {
        auto index = maploc->second.first;
        if (isValidIndex(index, mapBuilders) && maploc->second.second == QueryReuse::ENABLED) {
            auto& builder = std::get<0>(mapBuilders[index]);
            if (builder.isCompleted()) {
                auto center = generateMapObjectCounter();
                if (center == builder.getCounterCode()) {
                    return builder.generate();
                }
                builder.reset();
            }
            if (builder.isActive()) {
                return "#wait";
            }
        }

        initializeMapBuilder(queryStr, index, maploc->second.second, force_ordering);
        if (std::get<0>(mapBuilders[index]).isCompleted()) {
            if (maploc->second.second == QueryReuse::ENABLED) {
                auto center = generateMapObjectCounter();
                std::get<0>(mapBuilders[index]).setCounterCode(center);
            }
            return std::get<0>(mapBuilders[index]).generate();
        }
        return "#wait";
    }
    if (queryStr == "dependencies") {
        nlohmann::json base;
        loadBasicJsonInfo(base, nullptr);
        base["dependents"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependents()) {
            base["dependents"].push_back(dep.baseValue());
        }
        base["dependencies"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependencies()) {
            base["dependencies"].push_back(dep.baseValue());
        }
        return fileops::generateJsonString(base);
    }
    if (queryStr == "federate_map") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [](nlohmann::json& val, const FedInfo& fed) {
            if (fed.fed->try_lock()) {
                addFederateTags(val, fed.fed);
                fed.fed->unlock();
            } else {
                addFederateTags(val, fed.fed);
            }
        });
        // add core tags if needed
        if (!tags.empty()) {
            nlohmann::json tagBlock = nlohmann::json::object();
            for (const auto& tag : tags) {
                tagBlock[tag.first] = tag.second;
            }
            base["tags"] = tagBlock;
        }
        return fileops::generateJsonString(base);
    }
    // check tag value for a matching string
    for (const auto& tag : tags) {
        if (tag.first == queryStr) {
            return generateJsonQuotedString(tag.second);
        }
    }
    // if nothing found generate an error response
    return generateJsonErrorResponse(JsonErrorCodes::BAD_REQUEST, "unrecognized core query");
}